

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&,_const_int_&>
* __thiscall
Catch::ExprLhs<type_safe::basic_optional<type_safe::direct_optional_storage<int>>const&>::operator<
          (BinaryExpr<const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&,_const_int_&>
           *__return_storage_ptr__,
          ExprLhs<type_safe::basic_optional<type_safe::direct_optional_storage<int>>const&> *this,
          int *rhs)

{
  basic_optional<type_safe::direct_optional_storage<int>_> *pbVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = (((type_safe::direct_optional_storage<int>::
          value_type)(({parm#1}.value)()))<{parm#2})type_safe::operator<
                    (*(basic_optional<type_safe::direct_optional_storage<int>_> **)this,rhs);
  pbVar1 = *(basic_optional<type_safe::direct_optional_storage<int>_> **)this;
  StringRef::StringRef(&local_38,"<");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021de90;
  __return_storage_ptr__->m_lhs = pbVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator < ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs < rhs), m_lhs, "<", rhs };
        }